

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_display_options.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined8 uVar6;
  ALLEGRO_DISPLAY *new_display;
  ALLEGRO_DISPLAY_MODE mode;
  int change;
  int f;
  int column;
  int row;
  int y;
  int dw;
  ALLEGRO_EVENT event;
  _Bool redraw;
  ALLEGRO_TIMER *timer;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_DISPLAY *display;
  undefined4 local_c0;
  undefined4 local_bc;
  uint local_b0;
  uint local_ac;
  int local_a8;
  int local_a4;
  undefined4 local_a0;
  int local_9c;
  int local_98 [8];
  int local_78;
  int local_74;
  int local_58;
  long local_18;
  
  bVar1 = false;
  uVar2 = al_install_system(0x5020700,atexit);
  if ((uVar2 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  init_flags();
  al_init_primitives_addon();
  uVar3._0_4_ = 1.0;
  uVar3._4_4_ = 0.0;
  white._0_8_ = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000);
  white._8_8_ = uVar3;
  al_install_keyboard();
  al_install_mouse();
  al_init_font_addon();
  local_18 = al_create_display(800,600);
  if (local_18 == 0) {
    abort_example("Could not create display.\n");
  }
  load_font();
  uVar3 = al_create_timer(0x3f91111111111111);
  modes_count = al_get_num_display_modes();
  options_count = 0x18;
  update_ui();
  uVar4 = 0x3f800000;
  uVar6 = al_map_rgb_f(0x3f800000);
  al_clear_to_color(uVar6,uVar4);
  display_options((ALLEGRO_DISPLAY *)mode._8_8_);
  al_flip_display();
  uVar6 = al_create_event_queue();
  uVar4 = al_get_keyboard_event_source();
  al_register_event_source(uVar6,uVar4);
  uVar4 = al_get_mouse_event_source();
  al_register_event_source(uVar6,uVar4);
  uVar4 = al_get_display_event_source(local_18);
  al_register_event_source(uVar6,uVar4);
  uVar4 = al_get_timer_event_source(uVar3);
  al_register_event_source(uVar6,uVar4);
  al_start_timer(uVar3);
  while (al_wait_for_event(uVar6,local_98), local_98[0] != 0x2a) {
    if ((local_98[0] == 0x15) && (local_58 == 1)) {
      local_9c = al_get_display_width(local_18);
      local_a0 = 10;
      local_a4 = (local_74 + -10) / font_h + -1;
      local_a8 = local_78 / (local_9c / 2);
      if ((local_a8 == 0) && ((-1 < local_a4 && (local_a4 <= modes_count)))) {
        bVar1 = true;
        selected_column = local_a8;
        selected_mode = local_a4;
      }
      if (((local_a8 == 1) && (-1 < local_a4)) && (local_a4 < options_count)) {
        bVar1 = true;
        selected_column = local_a8;
        selected_option = local_a4;
      }
    }
    if ((local_98[0] == 0x1e) && (local_ac = al_get_display_flags(local_18), local_ac != flags)) {
      bVar1 = true;
      old_flags = local_ac | old_flags;
      flags = local_ac;
    }
    if (local_98[0] == 0xb) {
      if (local_78 == 0x3b) break;
      if (local_78 == 0x52) {
        selected_column = 0;
        bVar1 = true;
      }
      if (local_78 == 0x53) {
        selected_column = 1;
        bVar1 = true;
      }
      if (local_78 == 0x54) {
        if (selected_column == 0) {
          selected_mode = selected_mode + -1;
        }
        if (selected_column == 1) {
          selected_option = selected_option + -1;
        }
        bVar1 = true;
      }
      if (local_78 == 0x55) {
        if (selected_column == 0) {
          selected_mode = selected_mode + 1;
        }
        if (selected_column == 1) {
          selected_option = selected_option + 1;
        }
        bVar1 = true;
      }
      if (local_78 == 0x43) {
        if (selected_column == 0) {
          if (selected_mode < 2) {
            if (selected_mode == 1) {
              local_c0 = 800;
              local_bc = 600;
              al_set_new_display_flags(0x200);
            }
            else {
              local_c0 = 800;
              local_bc = 600;
              al_set_new_display_flags(1);
            }
          }
          else {
            al_get_display_mode(selected_mode + -2,&local_c0);
            al_set_new_display_flags(2);
          }
          al_destroy_font(font);
          font = (ALLEGRO_FONT *)0x0;
          lVar5 = al_create_display(local_c0,local_bc);
          if (lVar5 == 0) {
            sprintf(status,"Display creation failed.");
          }
          else {
            al_destroy_display(local_18);
            al_set_target_backbuffer(lVar5);
            uVar3 = al_get_display_event_source(lVar5);
            al_register_event_source(uVar6,uVar3);
            update_ui();
            sprintf(status,"Display creation succeeded.");
            local_18 = lVar5;
          }
          load_font();
        }
        if (selected_column == 1) {
          options[selected_option].required = options[selected_option].required + 1;
          options[selected_option].required = options[selected_option].required % 3;
          al_set_new_display_option
                    (options[selected_option].option,options[selected_option].value,
                     options[selected_option].required);
        }
        bVar1 = true;
      }
      local_b0 = (uint)(local_78 == 0x50);
      if (local_78 == 0x51) {
        local_b0 = 0xffffffff;
      }
      if ((local_b0 != 0) && (selected_column == 1)) {
        options[selected_option].value = local_b0 + options[selected_option].value;
        if (options[selected_option].value < 0) {
          options[selected_option].value = 0;
        }
        if (options[selected_option].max_value < options[selected_option].value) {
          options[selected_option].value = options[selected_option].max_value;
        }
        al_set_new_display_option
                  (options[selected_option].option,options[selected_option].value,
                   options[selected_option].required);
        bVar1 = true;
      }
    }
    if (selected_mode < 0) {
      selected_mode = 0;
    }
    if (modes_count + 1 < selected_mode) {
      selected_mode = modes_count + 1;
    }
    if (selected_option < 0) {
      selected_option = 0;
    }
    if (options_count <= selected_option) {
      selected_option = options_count + -1;
    }
    if (selected_mode < first_visible_row) {
      first_visible_row = selected_mode;
    }
    if (first_visible_row + visible_rows + -1 < selected_mode) {
      first_visible_row = (selected_mode - visible_rows) + 1;
    }
    if ((bVar1) && (uVar2 = al_is_event_queue_empty(uVar6), (uVar2 & 1) != 0)) {
      bVar1 = false;
      uVar4 = 0x3f800000;
      uVar3 = al_map_rgb_f(0x3f800000);
      al_clear_to_color(uVar3,uVar4);
      display_options((ALLEGRO_DISPLAY *)mode._8_8_);
      al_flip_display();
    }
  }
  al_destroy_font(font);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_TIMER *timer;
   bool redraw = false;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   init_flags();
   al_init_primitives_addon();
   
   white = al_map_rgba_f(1, 1, 1, 1);

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();

   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   load_font();

   timer = al_create_timer(1.0 / 60);

   modes_count = al_get_num_display_modes();
   options_count = sizeof(options) / sizeof(options[0]);
   
   update_ui();
   
   al_clear_to_color(al_map_rgb_f(1, 1, 1));
   display_options(display);
   al_flip_display();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            int dw = al_get_display_width(display);
            int y = 10;
            int row = (event.mouse.y - y) / font_h - 1;
            int column = event.mouse.x / (dw / 2);
            if (column == 0) {
               if (row >= 0 && row <= modes_count) {
                  selected_column = column;
                  selected_mode = row;
                  redraw = true;
               }
            }
            if (column == 1) {
               if (row >= 0 && row < options_count) {
                  selected_column = column;
                  selected_option = row;
                  redraw = true;
               }
            }
         }
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
          int f = al_get_display_flags(display);
          if (f != flags) {
              redraw = true;
              flags = f;
              old_flags |= f;
          }
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         int change;
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_LEFT) {
            selected_column = 0;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_RIGHT) {
            selected_column = 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_UP) {
            if (selected_column == 0) selected_mode -= 1;
            if (selected_column == 1) selected_option -= 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_DOWN) {
            if (selected_column == 0) selected_mode += 1;
            if (selected_column == 1) selected_option += 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_ENTER) {
             if (selected_column == 0) {
                ALLEGRO_DISPLAY_MODE mode;
                ALLEGRO_DISPLAY *new_display;
                if (selected_mode > 1) {
                    al_get_display_mode(selected_mode - 2, &mode);
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN);
                }
                else if (selected_mode == 1) {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN_WINDOW);
                }
                else {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_WINDOWED);
                }

                al_destroy_font(font);
                font = NULL;

                new_display = al_create_display(
                   mode.width, mode.height);
                if (new_display) {
                   al_destroy_display(display);
                   display = new_display;
                   al_set_target_backbuffer(display);
                   al_register_event_source(queue,
                      al_get_display_event_source(display));
                   update_ui();
                   sprintf(status, "Display creation succeeded.");
                }
                else {
                   sprintf(status, "Display creation failed.");
                }

                load_font();
             }
             if (selected_column == 1) {
                 options[selected_option].required += 1;
                 options[selected_option].required %= 3;
                 al_set_new_display_option(
                    options[selected_option].option,
                    options[selected_option].value,
                    options[selected_option].required);
             }
             redraw = true;
         }
         change = 0;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGUP) change = 1;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGDN) change = -1;
         if (change && selected_column == 1) {
            options[selected_option].value += change;
            if (options[selected_option].value < 0)
               options[selected_option].value = 0;
            if (options[selected_option].value >
               options[selected_option].max_value)
               options[selected_option].value =
                  options[selected_option].max_value;
            al_set_new_display_option(options[selected_option].option,
               options[selected_option].value,
               options[selected_option].required);
            redraw = true;
         }
      }
      
      if (selected_mode < 0) selected_mode = 0;
      if (selected_mode > modes_count + 1)
         selected_mode = modes_count + 1;
      if (selected_option < 0) selected_option = 0;
      if (selected_option >= options_count)
         selected_option = options_count - 1;
      if (selected_mode < first_visible_row)
         first_visible_row = selected_mode;
      if (selected_mode > first_visible_row + visible_rows - 1)
         first_visible_row = selected_mode - visible_rows + 1;

      if (redraw && al_is_event_queue_empty(queue)) {
         redraw = false;
         al_clear_to_color(al_map_rgb_f(1, 1, 1));
         display_options(display);
         al_flip_display();
      }
   }

   al_destroy_font(font);

   return 0;
}